

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

string * __thiscall LTAircraft::RelativePositionText_abi_cxx11_(LTAircraft *this)

{
  bool bVar1;
  uint uVar2;
  double *pdVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  LTAircraft *in_RSI;
  string *in_RDI;
  float fVar6;
  double dVar7;
  char out [100];
  vectorTy vecRel;
  DataRefs *in_stack_fffffffffffffec8;
  positionTy *pos2;
  positionTy *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  allocator<char> local_d9;
  string local_d8 [32];
  char local_b8 [40];
  positionTy *in_stack_ffffffffffffff70;
  positionTy *in_stack_ffffffffffffff78;
  positionTy *in_stack_ffffffffffffff88;
  double local_48;
  double in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  pdVar3 = positionTy::lat(&in_RSI->nearestAirportPos);
  uVar2 = std::isnan(*pdVar3);
  if (((uVar2 & 1) != 0) ||
     (bVar1 = CheckEverySoOften((float *)in_stack_fffffffffffffed0,
                                (float)((ulong)in_stack_fffffffffffffec8 >> 0x20)), bVar1)) {
    fVar6 = DataRefs::GetMiscNetwTime(in_stack_fffffffffffffec8);
    in_RSI->lastNearestAirportCheck = fVar6;
    pdVar3 = positionTy::lat(&in_RSI->nearestAirportPos);
    *pdVar3 = NAN;
    pdVar3 = positionTy::lon(&in_RSI->nearestAirportPos);
    *pdVar3 = NAN;
    GetPPos(in_RSI);
    GetNearestAirportId_abi_cxx11_(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::__cxx11::string::operator=((string *)&in_RSI->nearestAirport,local_30);
    std::__cxx11::string::~string(local_30);
    pdVar3 = positionTy::lat(&in_RSI->nearestAirportPos);
    uVar2 = std::isnan(*pdVar3);
    if ((uVar2 & 1) != 0) {
      GetPPos(in_RSI);
      positionTy::operator_cast_to_string(in_stack_ffffffffffffff88);
      return in_RDI;
    }
  }
  pos2 = &in_RSI->nearestAirportPos;
  GetPPos(in_RSI);
  positionTy::between(in_stack_fffffffffffffed0,pos2);
  dVar7 = local_48 / 1852.0;
  HeadingText_abi_cxx11_(in_stack_ffffffffffffffc8);
  uVar4 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::c_str();
  snprintf(local_b8,100,"%.1fnm %s of %s",dVar7,uVar4,uVar5);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff10,(char *)in_RSI,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator(&local_d9);
  return in_RDI;
}

Assistant:

std::string LTAircraft::RelativePositionText ()
{
    // find/update the nearest airport when needed or
    if (std::isnan(nearestAirportPos.lat()) ||
        CheckEverySoOften(lastNearestAirportCheck, ACI_NEAR_AIRPRT_PERIOD))
    {
        lastNearestAirportCheck = dataRefs.GetMiscNetwTime();
    
        // Find the nearest airport
        nearestAirportPos.lat() = NAN;
        nearestAirportPos.lon() = NAN;
        nearestAirport = GetNearestAirportId(GetPPos(), &nearestAirportPos);
        if (std::isnan(nearestAirportPos.lat())) {   // no airport found?
            return std::string(GetPPos());
        }
    }
    
    // determine bearing from airport to position
    vectorTy vecRel = nearestAirportPos.between(GetPPos());
    
    // put together a nice string
    char out[100];
    snprintf(out, sizeof(out), "%.1fnm %s of %s",
             vecRel.dist / M_per_NM, HeadingText(vecRel.angle).c_str(), nearestAirport.c_str());
    return std::string(out);
}